

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.cc
# Opt level: O3

LinearObjBuilder __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::AddObj
          (BasicProblem<mp::BasicProblemParams<int>_> *this,Type type,NumericExpr expr,
          int num_linear_terms)

{
  small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *this_00;
  LinearExprBuilder local_a0;
  LinearExpr local_98;
  
  std::vector<bool,_std::allocator<bool>_>::push_back(&this->is_obj_max_,type != MIN);
  local_98.terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
  super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr =
       (ptr)&local_98.terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.
             m_data.m_storage;
  local_98.terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
  super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_capacity = 6;
  local_98.terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
  super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_size = 0;
  std::vector<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>::emplace_back<mp::LinearExpr>
            (&this->linear_objs_,&local_98);
  if (6 < local_98.terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
          super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_capacity) {
    operator_delete(local_98.terms_.
                    super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
                    super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr,
                    local_98.terms_.
                    super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
                    super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_capacity
                    << 4);
  }
  this_00 = (small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)
            ((this->linear_objs_).
             super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
             super__Vector_impl_data._M_finish + -1);
  gch::detail::small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::request_capacity
            (this_00,(long)num_linear_terms);
  if (expr.super_ExprBase.impl_ != (Impl *)0x0) {
    SetNonlinearObjExpr(this,(int)((ulong)((long)(this->linear_objs_).
                                                 super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->linear_objs_).
                                                super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                             -0x11111111 + -1,expr);
  }
  LinearExprBuilder::LinearExprBuilder(&local_a0,(LinearExpr *)this_00);
  return (LinearObjBuilder)local_a0.expr_;
}

Assistant:

typename BasicProblem<Alloc>::LinearObjBuilder BasicProblem<Alloc>::AddObj(
    obj::Type type, NumericExpr expr, int num_linear_terms) {
  MP_ASSERT(linear_objs_.size() < MP_MAX_PROBLEM_ITEMS, "too many objectives");
  is_obj_max_.push_back(type != obj::MIN);
  linear_objs_.push_back(LinearExpr());
  LinearExpr &linear_expr = linear_objs_.back();
  linear_expr.Reserve(num_linear_terms);
  if (expr)
    SetNonlinearObjExpr(static_cast<int>(linear_objs_.size() - 1), expr);
  return LinearObjBuilder(&linear_expr);
}